

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O0

ParseResult * __thiscall
trivialre::re_compiler::C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy>
::ParseAlt(ParseResult *__return_storage_ptr__,
          C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *this,
          string_view str)

{
  string_view str_00;
  type *ptVar1;
  bool bVar2;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
  *pfVar3;
  basic_string_view<char,_std::char_traits<char>_> str_01;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
  local_1a0;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
  local_180;
  Matcher local_160;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
  local_140;
  type *local_120;
  type *str_r;
  type *maybe_right;
  char *local_108;
  ParseResult local_100;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
  local_c8;
  size_t local_98;
  char *pcStack_90;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  type *str_l;
  type *maybe_left;
  char *pcStack_70;
  ParseResult local_60;
  C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *local_28;
  C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *this_local;
  string_view str_local;
  
  pcStack_70 = str._M_str;
  maybe_left = (type *)str._M_len;
  local_28 = this;
  this_local = (C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *)
               maybe_left;
  str_local._M_len = (size_t)pcStack_70;
  str_local._M_str = (char *)__return_storage_ptr__;
  ParseRun(&local_60,this,str);
  str_l = (type *)std::
                  get<0ul,std::optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>,std::basic_string_view<char,std::char_traits<char>>>
                            (&local_60);
  local_88 = std::
             get<1ul,std::optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>,std::basic_string_view<char,std::char_traits<char>>>
                       (&local_60);
  local_98 = local_88->_M_len;
  pcStack_90 = local_88->_M_str;
  str_00._M_len = local_88->_M_len;
  str_00._M_str = local_88->_M_str;
  bVar2 = IsCharAt(this,str_00,0,'|');
  if (bVar2) {
    bVar2 = std::optional::operator_cast_to_bool((optional *)str_l);
    ptVar1 = str_l;
    if (!bVar2) {
      matchers::MatcherBuilder::Any();
      std::
      optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
      ::
      emplace<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                ((optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                  *)ptVar1,&local_c8);
      std::
      function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
      ::~function(&local_c8);
    }
    str_01 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (local_88,1,0xffffffffffffffff);
    local_108 = str_01._M_str;
    maybe_right = (type *)str_01._M_len;
    ParseAlt(&local_100,this,str_01);
    str_r = (type *)std::
                    get<0ul,std::optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>,std::basic_string_view<char,std::char_traits<char>>>
                              (&local_100);
    local_120 = std::
                get<1ul,std::optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>,std::basic_string_view<char,std::char_traits<char>>>
                          (&local_100);
    bVar2 = std::optional::operator_cast_to_bool((optional *)str_r);
    ptVar1 = str_r;
    if (!bVar2) {
      matchers::MatcherBuilder::Any();
      std::
      optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
      ::
      emplace<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                ((optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                  *)ptVar1,&local_140);
      std::
      function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
      ::~function(&local_140);
    }
    pfVar3 = std::
             optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
             ::value((optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                      *)str_l);
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
    ::function(&local_180,pfVar3);
    pfVar3 = std::
             optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
             ::value((optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                      *)str_r);
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
    ::function(&local_1a0,pfVar3);
    matchers::MatcherBuilder::Alt(&local_160,&local_180,&local_1a0);
    std::
    pair<std::optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
              (__return_storage_ptr__,&local_160,local_120);
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
    ::~function(&local_160);
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
    ::~function(&local_1a0);
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
    ::~function(&local_180);
    std::
    pair<std::optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::~pair(&local_100);
  }
  else {
    std::
    pair<std::optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
              (__return_storage_ptr__,
               (optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                *)str_l,local_88);
  }
  std::
  pair<std::optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::~pair(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ParseResult ParseAlt(std::string_view str) {
    auto [maybe_left, str_l] = ParseRun(str);
    if (IsCharAt(str_l, 0, '|')) {
      if (!maybe_left) {
        maybe_left.emplace(builder.Any());
      }
      auto [maybe_right, str_r] = ParseAlt(str_l.substr(1));
      if (!maybe_right) {
        maybe_right.emplace(builder.Any());
      }
      return {builder.Alt(std::move(maybe_left.value()), std::move(maybe_right.value())), str_r};
    }
    return {std::move(maybe_left), str_l};
  }